

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O0

QStringList * QtPrivate::QStringList_filter(QStringList *that,QLatin1StringMatcher *matcher)

{
  QStringView haystack;
  bool bVar1;
  const_iterator o;
  QStringView *this;
  qsizetype qVar2;
  QLatin1StringMatcher *in_RDX;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QString *s;
  QStringList *__range1;
  QStringList *res;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_type in_stack_ffffffffffffff58;
  QList<QString> *in_stack_ffffffffffffff60;
  QLatin1StringMatcher *this_00;
  QStringList *pQVar3;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  pQVar3 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x54a4b2);
  local_10.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QString>::begin(in_stack_ffffffffffffff60);
  o = QList<QString>::end(in_stack_ffffffffffffff60);
  while (bVar1 = QList<QString>::const_iterator::operator!=(&local_10,o), bVar1) {
    this = (QStringView *)QList<QString>::const_iterator::operator*(&local_10);
    this_00 = in_RDX;
    QStringView::QStringView<QString,_true>(this,(QString *)in_RDX);
    haystack.m_data = (storage_type_conflict *)pQVar3;
    haystack.m_size = (qsizetype)in_RDI;
    qVar2 = QLatin1StringMatcher::indexIn(this_00,haystack,(qsizetype)in_stack_ffffffffffffff60);
    if (qVar2 != -1) {
      QList<QString>::append(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    QList<QString>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList &that, const QLatin1StringMatcher &matcher)
{
    QStringList res;
    for (const auto &s : that) {
        if (matcher.indexIn(s) != -1)
            res.append(s);
    }
    return res;
}